

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O0

intptr_t __thiscall xemmai::t_tuple::f_hash(t_tuple *this)

{
  t_object *a_object;
  ulong uVar1;
  undefined1 local_30 [8];
  t_value<xemmai::t_pointer> x;
  size_t i;
  intptr_t n;
  t_tuple *this_local;
  
  i = 0;
  for (x.field_0.v_integer = 0; (ulong)x.field_0 < this->v_size;
      x.field_0.v_integer = x.field_0.v_integer + 1) {
    operator[](this,x.field_0.v_integer);
    t_value<xemmai::t_slot>::f_hash((t_value<xemmai::t_slot> *)local_30);
    a_object = t_pointer::operator_cast_to_t_object_((t_pointer *)local_30);
    f_check<long>(a_object,L"value");
    uVar1 = f_as<long,xemmai::t_value<xemmai::t_pointer>&>((t_value<xemmai::t_pointer> *)local_30);
    i = uVar1 ^ i;
  }
  return i;
}

Assistant:

intptr_t t_tuple::f_hash() const
{
	intptr_t n = 0;
	for (size_t i = 0; i < v_size; ++i) {
		auto x = (*this)[i].f_hash();
		f_check<intptr_t>(x, L"value");
		n ^= f_as<intptr_t>(x);
	}
	return n;
}